

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

xmlEntityPtr xmlSAX2GetEntity(void *ctx,xmlChar *name)

{
  xmlEntityPtr local_30;
  xmlEntityPtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar *name_local;
  void *ctx_local;
  
  if (ctx == (void *)0x0) {
    ctx_local = (void *)0x0;
  }
  else if ((*(int *)((long)ctx + 0x150) != 0) ||
          (ctx_local = xmlGetPredefinedEntity(name), (xmlEntityPtr)ctx_local == (xmlEntityPtr)0x0))
  {
    if ((*(long *)((long)ctx + 0x10) == 0) || (*(int *)(*(long *)((long)ctx + 0x10) + 0x4c) != 1)) {
      local_30 = xmlGetDocEntity(*(xmlDoc **)((long)ctx + 0x10),name);
    }
    else if (*(int *)((long)ctx + 0x150) == 2) {
      *(undefined4 *)(*(long *)((long)ctx + 0x10) + 0x4c) = 0;
      local_30 = xmlGetDocEntity(*(xmlDoc **)((long)ctx + 0x10),name);
      *(undefined4 *)(*(long *)((long)ctx + 0x10) + 0x4c) = 1;
    }
    else {
      local_30 = xmlGetDocEntity(*(xmlDoc **)((long)ctx + 0x10),name);
      if (local_30 == (xmlEntityPtr)0x0) {
        *(undefined4 *)(*(long *)((long)ctx + 0x10) + 0x4c) = 0;
        local_30 = xmlGetDocEntity(*(xmlDoc **)((long)ctx + 0x10),name);
        if (local_30 != (xmlEntityPtr)0x0) {
          xmlFatalErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_NOT_STANDALONE,
                         "Entity(%s) document marked standalone but requires external subset\n",name
                         ,(xmlChar *)0x0);
        }
        *(undefined4 *)(*(long *)((long)ctx + 0x10) + 0x4c) = 1;
      }
    }
    ctx_local = local_30;
  }
  return (xmlEntityPtr)ctx_local;
}

Assistant:

xmlEntityPtr
xmlSAX2GetEntity(void *ctx, const xmlChar *name)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlEntityPtr ret = NULL;

    if (ctx == NULL) return(NULL);

    if (ctxt->inSubset == 0) {
	ret = xmlGetPredefinedEntity(name);
	if (ret != NULL)
	    return(ret);
    }
    if ((ctxt->myDoc != NULL) && (ctxt->myDoc->standalone == 1)) {
	if (ctxt->inSubset == 2) {
	    ctxt->myDoc->standalone = 0;
	    ret = xmlGetDocEntity(ctxt->myDoc, name);
	    ctxt->myDoc->standalone = 1;
	} else {
	    ret = xmlGetDocEntity(ctxt->myDoc, name);
	    if (ret == NULL) {
		ctxt->myDoc->standalone = 0;
		ret = xmlGetDocEntity(ctxt->myDoc, name);
		if (ret != NULL) {
		    xmlFatalErrMsg(ctxt, XML_ERR_NOT_STANDALONE,
	 "Entity(%s) document marked standalone but requires external subset\n",
				   name, NULL);
		}
		ctxt->myDoc->standalone = 1;
	    }
	}
    } else {
	ret = xmlGetDocEntity(ctxt->myDoc, name);
    }
    return(ret);
}